

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O3

void __thiscall
cmLocalGenerator::AddBuildTargetRule(cmLocalGenerator *this,string *llang,cmGeneratorTarget *target)

{
  char **ppcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  cmMakefile *pcVar4;
  cmSourceFile *this_00;
  _Alloc_hider comment_00;
  bool bVar5;
  char *pcVar6;
  cmCustomCommand *pcVar7;
  long *plVar8;
  cmTarget *pcVar9;
  char *command;
  pointer s;
  pointer ppcVar10;
  string targetFullPath;
  string createRule;
  string linkLibs;
  string comment;
  string langFlags;
  string targetName;
  string objs;
  string local_270;
  Snapshot *local_250;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> classes;
  string linkFlags;
  string flags;
  string linkPath;
  string frameworkPath;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  rules;
  cmCustomCommandLines commandLines;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  objVector;
  string config;
  RuleVariables vars;
  
  objs._M_dataplus._M_p = (pointer)&objs.field_2;
  objs._M_string_length = 0;
  objs.field_2._M_local_buf[0] = '\0';
  objVector.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  objVector.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  objVector.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pcVar4 = this->Makefile;
  ppcVar1 = &vars.TargetCompilePDB;
  vars.CMTarget = (cmTarget *)ppcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&vars,"CMAKE_BUILD_TYPE","");
  pcVar6 = cmMakefile::GetSafeDefinition(pcVar4,(string *)&vars);
  std::__cxx11::string::string((string *)&config,pcVar6,(allocator *)&createRule);
  if (vars.CMTarget != (cmTarget *)ppcVar1) {
    operator_delete(vars.CMTarget,(ulong)(vars.TargetCompilePDB + 1));
  }
  classes.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  classes.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  classes.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmGeneratorTarget::GetSourceFiles(target,&classes,&config);
  if (classes.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      classes.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_250 = &this->StateSnapshot;
    ppcVar10 = classes.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    do {
      this_00 = *ppcVar10;
      pcVar7 = cmSourceFile::GetCustomCommand(this_00);
      if (pcVar7 == (cmCustomCommand *)0x0) {
        vars.CMTarget = (cmTarget *)ppcVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&vars,"HEADER_FILE_ONLY","");
        bVar5 = cmSourceFile::GetPropertyAsBool(this_00,(string *)&vars);
        if (bVar5) {
          bVar5 = false;
        }
        else {
          createRule._M_dataplus._M_p = (pointer)&createRule.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&createRule,"EXTERNAL_OBJECT","");
          bVar5 = cmSourceFile::GetPropertyAsBool(this_00,&createRule);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)createRule._M_dataplus._M_p != &createRule.field_2) {
            operator_delete(createRule._M_dataplus._M_p,createRule.field_2._M_allocated_capacity + 1
                           );
          }
          bVar5 = !bVar5;
        }
        if (vars.CMTarget != (cmTarget *)ppcVar1) {
          operator_delete(vars.CMTarget,(ulong)(vars.TargetCompilePDB + 1));
        }
        if (bVar5) {
          vars.TargetPDB = (char *)0x0;
          vars.TargetCompilePDB = (char *)((ulong)vars.TargetCompilePDB & 0xffffffffffffff00);
          vars.CMTarget = (cmTarget *)ppcVar1;
          cmState::Snapshot::GetCurrentBinaryDirectory(local_250);
          std::__cxx11::string::append((char *)&vars);
          std::__cxx11::string::append((char *)&vars);
          GetObjectFileNameWithoutTarget(&createRule,this,this_00,(string *)&vars,(bool *)0x0);
          if (createRule._M_string_length != 0) {
            pcVar6 = cmState::Snapshot::GetCurrentBinaryDirectory(local_250);
            std::__cxx11::string::string((string *)&targetName,pcVar6,(allocator *)&linkLibs);
            std::__cxx11::string::append((char *)&targetName);
            std::__cxx11::string::_M_append((char *)&targetName,(ulong)createRule._M_dataplus._M_p);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&objVector,&targetName);
            AddCustomCommandToCreateObject(this,targetName._M_dataplus._M_p,llang,*ppcVar10,target);
            cmOutputConverter::Convert
                      (&linkLibs,&this->super_cmOutputConverter,&targetName,START_OUTPUT,SHELL);
            std::__cxx11::string::_M_append((char *)&objs,(ulong)linkLibs._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)linkLibs._M_dataplus._M_p != &linkLibs.field_2) {
              operator_delete(linkLibs._M_dataplus._M_p,
                              CONCAT71(linkLibs.field_2._M_allocated_capacity._1_7_,
                                       linkLibs.field_2._M_local_buf[0]) + 1);
            }
            std::__cxx11::string::append((char *)&objs);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)targetName._M_dataplus._M_p != &targetName.field_2) {
              operator_delete(targetName._M_dataplus._M_p,
                              targetName.field_2._M_allocated_capacity + 1);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)createRule._M_dataplus._M_p != &createRule.field_2) {
            operator_delete(createRule._M_dataplus._M_p,createRule.field_2._M_allocated_capacity + 1
                           );
          }
          if (vars.CMTarget != (cmTarget *)ppcVar1) {
            operator_delete(vars.CMTarget,(ulong)(vars.TargetCompilePDB + 1));
          }
        }
      }
      ppcVar10 = ppcVar10 + 1;
    } while (ppcVar10 !=
             classes.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  cmGeneratorTarget::GetCreateRuleVariable(&createRule,target,llang,&config);
  pcVar4 = this->Makefile;
  vars.CMTarget = (cmTarget *)ppcVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&vars,createRule._M_dataplus._M_p,
             createRule._M_dataplus._M_p + createRule._M_string_length);
  std::__cxx11::string::append((char *)&vars);
  bVar5 = cmMakefile::IsOn(pcVar4,(string *)&vars);
  if (vars.CMTarget != (cmTarget *)ppcVar1) {
    operator_delete(vars.CMTarget,(ulong)(vars.TargetCompilePDB + 1));
  }
  pcVar9 = target->Target;
  vars.CMTarget = (cmTarget *)ppcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&vars,"");
  cmTarget::GetFullName(&targetName,pcVar9,(string *)&vars,false);
  if (vars.CMTarget != (cmTarget *)ppcVar1) {
    operator_delete(vars.CMTarget,(ulong)(vars.TargetCompilePDB + 1));
  }
  linkLibs._M_dataplus._M_p = (pointer)&linkLibs.field_2;
  linkLibs._M_string_length = 0;
  linkLibs.field_2._M_local_buf[0] = '\0';
  frameworkPath._M_dataplus._M_p = (pointer)&frameworkPath.field_2;
  frameworkPath._M_string_length = 0;
  frameworkPath.field_2._M_local_buf[0] = '\0';
  linkPath._M_dataplus._M_p = (pointer)&linkPath.field_2;
  linkPath._M_string_length = 0;
  linkPath.field_2._M_local_buf[0] = '\0';
  flags._M_dataplus._M_p = (pointer)&flags.field_2;
  flags._M_string_length = 0;
  flags.field_2._M_local_buf[0] = '\0';
  linkFlags._M_dataplus._M_p = (pointer)&linkFlags.field_2;
  linkFlags._M_string_length = 0;
  linkFlags.field_2._M_local_buf[0] = '\0';
  GetTargetFlags(this,&linkLibs,&frameworkPath,&linkPath,&flags,&linkFlags,target,bVar5);
  std::operator+(&langFlags,&frameworkPath,&linkPath);
  plVar8 = (long *)std::__cxx11::string::_M_append
                             ((char *)&langFlags,(ulong)linkLibs._M_dataplus._M_p);
  pcVar9 = (cmTarget *)(plVar8 + 2);
  if ((cmTarget *)*plVar8 == pcVar9) {
    vars.TargetCompilePDB =
         *(char **)&(pcVar9->Properties).
                    super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
                    ._M_t._M_impl;
    vars.TargetVersionMajor = (char *)plVar8[3];
    vars.CMTarget = (cmTarget *)ppcVar1;
  }
  else {
    vars.TargetCompilePDB =
         *(char **)&(pcVar9->Properties).
                    super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
                    ._M_t._M_impl;
    vars.CMTarget = (cmTarget *)*plVar8;
  }
  vars.TargetPDB = (char *)plVar8[1];
  *plVar8 = (long)pcVar9;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  std::__cxx11::string::operator=((string *)&linkLibs,(string *)&vars);
  if (vars.CMTarget != (cmTarget *)ppcVar1) {
    operator_delete(vars.CMTarget,(ulong)(vars.TargetCompilePDB + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)langFlags._M_dataplus._M_p != &langFlags.field_2) {
    operator_delete(langFlags._M_dataplus._M_p,
                    CONCAT71(langFlags.field_2._M_allocated_capacity._1_7_,
                             langFlags.field_2._M_local_buf[0]) + 1);
  }
  memset(&vars,0,0xd8);
  vars.Language = (llang->_M_dataplus)._M_p;
  vars.Objects = objs._M_dataplus._M_p;
  vars.ObjectDir = ".";
  vars.Target = targetName._M_dataplus._M_p;
  vars.LinkLibraries = linkLibs._M_dataplus._M_p;
  vars.Flags = flags._M_dataplus._M_p;
  vars.LinkFlags = linkFlags._M_dataplus._M_p;
  langFlags._M_dataplus._M_p = (pointer)&langFlags.field_2;
  langFlags._M_string_length = 0;
  langFlags.field_2._M_local_buf[0] = '\0';
  targetFullPath._M_dataplus._M_p = (pointer)&targetFullPath.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&targetFullPath,"");
  AddLanguageFlags(this,&langFlags,llang,&targetFullPath);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)targetFullPath._M_dataplus._M_p != &targetFullPath.field_2) {
    operator_delete(targetFullPath._M_dataplus._M_p,targetFullPath.field_2._M_allocated_capacity + 1
                   );
  }
  targetFullPath._M_dataplus._M_p = (pointer)&targetFullPath.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&targetFullPath,"");
  AddArchitectureFlags(this,&langFlags,target,llang,&targetFullPath);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)targetFullPath._M_dataplus._M_p != &targetFullPath.field_2) {
    operator_delete(targetFullPath._M_dataplus._M_p,targetFullPath.field_2._M_allocated_capacity + 1
                   );
  }
  vars.LanguageCompileFlags = langFlags._M_dataplus._M_p;
  commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
  super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
  super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
  super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  rules.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  rules.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  rules.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pcVar6 = cmMakefile::GetRequiredDefinition(this->Makefile,&createRule);
  std::__cxx11::string::string((string *)&targetFullPath,pcVar6,(allocator *)&comment);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&rules,
             &targetFullPath);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)targetFullPath._M_dataplus._M_p != &targetFullPath.field_2) {
    operator_delete(targetFullPath._M_dataplus._M_p,targetFullPath.field_2._M_allocated_capacity + 1
                   );
  }
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmSystemTools::ExpandList(&rules,&commands);
  if (commands.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      commands.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    s = commands.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
    do {
      ExpandRuleVariables(this,s,&vars);
      targetFullPath._M_dataplus._M_p = (pointer)0x0;
      targetFullPath._M_string_length = 0;
      targetFullPath.field_2._M_allocated_capacity = 0;
      cmSystemTools::ParseArguments_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&comment,(cmSystemTools *)(s->_M_dataplus)._M_p,command);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &targetFullPath,targetFullPath._M_string_length,comment._M_dataplus._M_p);
      std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
                (&commandLines.
                  super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>,
                 (value_type *)&targetFullPath);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&comment);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&targetFullPath);
      s = s + 1;
    } while (s != commands.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish);
  }
  pcVar9 = target->Target;
  paVar2 = &comment.field_2;
  comment._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&comment,"");
  cmTarget::GetFullPath(&targetFullPath,pcVar9,&comment,false,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)comment._M_dataplus._M_p != paVar2) {
    operator_delete(comment._M_dataplus._M_p,comment.field_2._M_allocated_capacity + 1);
  }
  comment._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&comment,"Linking ","");
  std::__cxx11::string::_M_append((char *)&comment,(ulong)(llang->_M_dataplus)._M_p);
  std::__cxx11::string::append((char *)&comment);
  cmOutputConverter::Convert
            (&local_270,&this->super_cmOutputConverter,&targetFullPath,START_OUTPUT,UNCHANGED);
  std::__cxx11::string::_M_append((char *)&comment,(ulong)local_270._M_dataplus._M_p);
  paVar3 = &local_270.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != paVar3) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  pcVar4 = this->Makefile;
  local_270._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"");
  comment_00 = comment._M_dataplus;
  pcVar6 = cmState::Snapshot::GetCurrentBinaryDirectory(&this->StateSnapshot);
  cmMakefile::AddCustomCommandToOutput
            (pcVar4,&targetFullPath,&objVector,&local_270,&commandLines,comment_00._M_p,pcVar6,false
             ,true,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != paVar3) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  cmMakefile::GetSource(this->Makefile,&targetFullPath);
  cmTarget::AddSource(target->Target,&targetFullPath);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)comment._M_dataplus._M_p != paVar2) {
    operator_delete(comment._M_dataplus._M_p,comment.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)targetFullPath._M_dataplus._M_p != &targetFullPath.field_2) {
    operator_delete(targetFullPath._M_dataplus._M_p,targetFullPath.field_2._M_allocated_capacity + 1
                   );
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&commands);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&rules);
  std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector
            (&commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)langFlags._M_dataplus._M_p != &langFlags.field_2) {
    operator_delete(langFlags._M_dataplus._M_p,
                    CONCAT71(langFlags.field_2._M_allocated_capacity._1_7_,
                             langFlags.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)linkFlags._M_dataplus._M_p != &linkFlags.field_2) {
    operator_delete(linkFlags._M_dataplus._M_p,
                    CONCAT71(linkFlags.field_2._M_allocated_capacity._1_7_,
                             linkFlags.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)flags._M_dataplus._M_p != &flags.field_2) {
    operator_delete(flags._M_dataplus._M_p,
                    CONCAT71(flags.field_2._M_allocated_capacity._1_7_,flags.field_2._M_local_buf[0]
                            ) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)linkPath._M_dataplus._M_p != &linkPath.field_2) {
    operator_delete(linkPath._M_dataplus._M_p,
                    CONCAT71(linkPath.field_2._M_allocated_capacity._1_7_,
                             linkPath.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)frameworkPath._M_dataplus._M_p != &frameworkPath.field_2) {
    operator_delete(frameworkPath._M_dataplus._M_p,
                    CONCAT71(frameworkPath.field_2._M_allocated_capacity._1_7_,
                             frameworkPath.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)linkLibs._M_dataplus._M_p != &linkLibs.field_2) {
    operator_delete(linkLibs._M_dataplus._M_p,
                    CONCAT71(linkLibs.field_2._M_allocated_capacity._1_7_,
                             linkLibs.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)targetName._M_dataplus._M_p != &targetName.field_2) {
    operator_delete(targetName._M_dataplus._M_p,targetName.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)createRule._M_dataplus._M_p != &createRule.field_2) {
    operator_delete(createRule._M_dataplus._M_p,createRule.field_2._M_allocated_capacity + 1);
  }
  if (classes.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(classes.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)classes.
                          super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)classes.
                          super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)config._M_dataplus._M_p != &config.field_2) {
    operator_delete(config._M_dataplus._M_p,config.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&objVector);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)objs._M_dataplus._M_p != &objs.field_2) {
    operator_delete(objs._M_dataplus._M_p,
                    CONCAT71(objs.field_2._M_allocated_capacity._1_7_,objs.field_2._M_local_buf[0])
                    + 1);
  }
  return;
}

Assistant:

void cmLocalGenerator::AddBuildTargetRule(const std::string& llang,
                                          cmGeneratorTarget& target)
{
  std::string objs;
  std::vector<std::string> objVector;
  std::string config = this->Makefile->GetSafeDefinition("CMAKE_BUILD_TYPE");
  // Add all the sources outputs to the depends of the target
  std::vector<cmSourceFile*> classes;
  target.GetSourceFiles(classes, config);
  for(std::vector<cmSourceFile*>::const_iterator i = classes.begin();
      i != classes.end(); ++i)
    {
    cmSourceFile* sf = *i;
    if(!sf->GetCustomCommand() &&
       !sf->GetPropertyAsBool("HEADER_FILE_ONLY") &&
       !sf->GetPropertyAsBool("EXTERNAL_OBJECT"))
      {
      std::string dir_max;
      dir_max += this->StateSnapshot.GetCurrentBinaryDirectory();
      dir_max += "/";
      std::string obj = this->GetObjectFileNameWithoutTarget(*sf, dir_max);
      if(!obj.empty())
        {
        std::string ofname = this->StateSnapshot.GetCurrentBinaryDirectory();
        ofname += "/";
        ofname += obj;
        objVector.push_back(ofname);
        this->AddCustomCommandToCreateObject(ofname.c_str(),
                                             llang, *(*i), target);
        objs += this->Convert(ofname,START_OUTPUT,SHELL);
        objs += " ";
        }
      }
    }
  std::string createRule = target.GetCreateRuleVariable(llang, config);
  bool useWatcomQuote = this->Makefile->IsOn(createRule+"_USE_WATCOM_QUOTE");
  std::string targetName = target.Target->GetFullName();
  // Executable :
  // Shared Library:
  // Static Library:
  // Shared Module:
  std::string linkLibs; // should be set
  std::string frameworkPath;
  std::string linkPath;
  std::string flags; // should be set
  std::string linkFlags; // should be set
  this->GetTargetFlags(linkLibs, frameworkPath, linkPath, flags, linkFlags,
                       &target, useWatcomQuote);
  linkLibs = frameworkPath + linkPath + linkLibs;
  cmLocalGenerator::RuleVariables vars;
  vars.Language = llang.c_str();
  vars.Objects = objs.c_str();
  vars.ObjectDir = ".";
  vars.Target = targetName.c_str();
  vars.LinkLibraries = linkLibs.c_str();
  vars.Flags = flags.c_str();
  vars.LinkFlags = linkFlags.c_str();

  std::string langFlags;
  this->AddLanguageFlags(langFlags, llang, "");
  this->AddArchitectureFlags(langFlags, &target, llang, "");
  vars.LanguageCompileFlags = langFlags.c_str();

  cmCustomCommandLines commandLines;
  std::vector<std::string> rules;
  rules.push_back(this->Makefile->GetRequiredDefinition(createRule));
  std::vector<std::string> commands;
  cmSystemTools::ExpandList(rules, commands);
  for(std::vector<std::string>::iterator i = commands.begin();
      i != commands.end(); ++i)
    {
    // Expand the full command line string.
    this->ExpandRuleVariables(*i, vars);
    // Parse the string to get the custom command line.
    cmCustomCommandLine commandLine;
    std::vector<std::string> cmd = cmSystemTools::ParseArguments(i->c_str());
    commandLine.insert(commandLine.end(), cmd.begin(), cmd.end());

    // Store this command line.
    commandLines.push_back(commandLine);
    }
  std::string targetFullPath = target.Target->GetFullPath();
  // Generate a meaningful comment for the command.
  std::string comment = "Linking ";
  comment += llang;
  comment += " target ";
  comment += this->Convert(targetFullPath, START_OUTPUT);
  this->Makefile->AddCustomCommandToOutput(
    targetFullPath,
    objVector,
    "",
    commandLines,
    comment.c_str(),
    this->StateSnapshot.GetCurrentBinaryDirectory()
    );
  this->Makefile->GetSource(targetFullPath);
  target.Target->AddSource(targetFullPath);
}